

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
ModbusSimulationDataGenerator::CreateModbusByte(ModbusSimulationDataGenerator *this,U64 value)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  uint local_2c;
  BitExtractor local_28 [4];
  U32 i;
  BitExtractor bit_extractor;
  uint local_1c;
  U64 UStack_18;
  U32 num_bits;
  U64 value_local;
  ModbusSimulationDataGenerator *this_local;
  
  SimulationChannelDescriptor::Transition();
  iVar1 = (int)this;
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptor::Advance(iVar1 + 0x30);
  UStack_18 = value;
  if ((this->mSettings->mInverted & 1U) == 1) {
    UStack_18 = value ^ 0xffffffffffffffff;
  }
  local_1c = this->mSettings->mBitsPerTransfer;
  if ((this->mSettings->mModbusMode == MpModeMsbOneMeansAddress) ||
     (this->mSettings->mModbusMode == MpModeMsbZeroMeansAddress)) {
    local_1c = local_1c + 1;
  }
  BitExtractor::BitExtractor(local_28,UStack_18,this->mSettings->mShiftOrder,local_1c);
  for (local_2c = 0; local_2c < local_1c; local_2c = local_2c + 1) {
    BitExtractor::GetNextBit();
    SimulationChannelDescriptor::TransitionIfNeeded(iVar1 + 0x30);
    ClockGenerator::AdvanceByHalfPeriod(1.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
  }
  if (this->mSettings->mParity == EvenOne) {
    uVar3 = AnalyzerHelpers::GetOnesCount(UStack_18);
    bVar2 = AnalyzerHelpers::IsEven((ulong)uVar3);
    if ((bVar2 & 1) == 1) {
      SimulationChannelDescriptor::TransitionIfNeeded(iVar1 + 0x30);
    }
    else {
      SimulationChannelDescriptor::TransitionIfNeeded(iVar1 + 0x30);
    }
    ClockGenerator::AdvanceByHalfPeriod(1.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
  }
  else if (this->mSettings->mParity == OddOne) {
    uVar3 = AnalyzerHelpers::GetOnesCount(UStack_18);
    bVar2 = AnalyzerHelpers::IsOdd((ulong)uVar3);
    if ((bVar2 & 1) == 1) {
      SimulationChannelDescriptor::TransitionIfNeeded(iVar1 + 0x30);
    }
    else {
      SimulationChannelDescriptor::TransitionIfNeeded(iVar1 + 0x30);
    }
    ClockGenerator::AdvanceByHalfPeriod(1.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
  }
  SimulationChannelDescriptor::TransitionIfNeeded(iVar1 + 0x30);
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptor::Advance(iVar1 + 0x30);
  if (this->mSettings->mParity == NoneTwo) {
    ClockGenerator::AdvanceByHalfPeriod(1.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
  }
  BitExtractor::~BitExtractor(local_28);
  return;
}

Assistant:

void ModbusSimulationDataGenerator::CreateModbusByte( U64 value )
{
    // assume we start high
    mModbusSimulationData.Transition();                                     // low-going edge for start bit
    mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod() ); // add start bit time

    if( mSettings->mInverted == true )
        value = ~value;

    U32 num_bits = mSettings->mBitsPerTransfer;
    if( mSettings->mModbusMode == ModbusAnalyzerEnums::MpModeMsbOneMeansAddress ||
        mSettings->mModbusMode == ModbusAnalyzerEnums::MpModeMsbZeroMeansAddress )
        num_bits++;

    BitExtractor bit_extractor( value, mSettings->mShiftOrder, num_bits );

    for( U32 i = 0; i < num_bits; i++ )
    {
        mModbusSimulationData.TransitionIfNeeded( bit_extractor.GetNextBit() );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod() );
    }

    if( mSettings->mParity == ModbusAnalyzerEnums::EvenOne )
    {
        if( AnalyzerHelpers::IsEven( AnalyzerHelpers::GetOnesCount( value ) ) == true )
            mModbusSimulationData.TransitionIfNeeded( mBitLow ); // we want to add a zero bit
        else
            mModbusSimulationData.TransitionIfNeeded( mBitHigh ); // we want to add a one bit

        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod() );
    }
    else if( mSettings->mParity == ModbusAnalyzerEnums::OddOne )
    {
        if( AnalyzerHelpers::IsOdd( AnalyzerHelpers::GetOnesCount( value ) ) == true )
            mModbusSimulationData.TransitionIfNeeded( mBitLow ); // we want to add a zero bit
        else
            mModbusSimulationData.TransitionIfNeeded( mBitHigh );

        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod() );
    }

    mModbusSimulationData.TransitionIfNeeded( mBitHigh ); // we need to end high

    // lets pad the end a bit for the stop bit:
    // we're still using these old settings becuase it's not worth it right now to tear them all out.
    mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 1.0 ) );

    if( mSettings->mParity == ModbusAnalyzerEnums::NoneTwo )
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 1.0 ) );
}